

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::LoopConstraint::calcConstraintJacobian
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,
          MatrixNd *GSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  reference pvVar1;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDX;
  SpatialVector *in_RSI;
  SpatialTransform *in_RDI;
  long in_R9;
  bool in_stack_0000003f;
  Vector3d *in_stack_00000040;
  uint in_stack_0000004c;
  VectorNd *in_stack_00000050;
  Model *in_stack_00000058;
  uint i;
  undefined1 in_stack_000004ef;
  MatrixNd *in_stack_000004f0;
  Vector3d *in_stack_000004f8;
  uint in_stack_00000504;
  VectorNd *in_stack_00000508;
  Model *in_stack_00000510;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_fffffffffffffe28;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  undefined4 in_stack_fffffffffffffe58;
  value_type blockRows;
  undefined4 in_stack_fffffffffffffe70;
  value_type vVar2;
  undefined1 in_stack_fffffffffffffeab;
  uint in_stack_fffffffffffffeac;
  VectorNd *in_stack_fffffffffffffeb0;
  Model *in_stack_fffffffffffffeb8;
  uint local_d4;
  SpatialVector *v_sp;
  SpatialTransform *this_01;
  
  this_01 = in_RDI;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe30);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffe30);
  other = in_RDX;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((in_RDI->E).super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array + 7),0);
  blockRows = *pvVar1;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)((in_RDI->r).super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 1),0);
  CalcPointJacobian6D(in_stack_00000510,in_stack_00000508,in_stack_00000504,in_stack_000004f8,
                      in_stack_000004f0,(bool)in_stack_000004ef);
  v_sp = in_RSI;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((in_RDI->E).super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array + 7),1);
  vVar2 = *pvVar1;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)((in_RDI->r).super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 1),1);
  CalcPointJacobian6D(in_stack_00000510,in_stack_00000508,in_stack_00000504,in_stack_000004f8,
                      in_stack_000004f0,(bool)in_stack_000004ef);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             CONCAT44(blockRows,in_stack_fffffffffffffe58),other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffe28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((in_RDI->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             7),0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)((in_RDI->r).super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 1),0);
  CalcBodyToBaseCoordinates
            (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000040,
             in_stack_0000003f);
  Vector3_t::operator=
            ((Vector3_t *)in_stack_fffffffffffffe30,(Vector3_t *)in_stack_fffffffffffffe28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((in_RDI->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             7),0);
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             (bool)in_stack_fffffffffffffeab);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe28);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)((in_RDI->r).super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 1),0);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            (in_stack_fffffffffffffe30,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe28);
  Matrix3_t::operator=((Matrix3_t *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (local_d4 = 0;
      local_d4 <
      *(uint *)((in_RDI->E).super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 6); local_d4 = local_d4 + 1) {
    this_00 = (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
              (in_R9 + 0x470);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI[2].E.super_Matrix3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 3),(ulong)local_d4);
    Math::SpatialTransform::apply(this_01,v_sp);
    SpatialVector_t::operator=
              ((SpatialVector_t *)this_00,(SpatialVector_t *)in_stack_fffffffffffffe28);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffe28);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>>::operator*
              (this_00,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffffe28);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x801ea3);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,long>
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               CONCAT44(vVar2,in_stack_fffffffffffffe70),(Index)in_RDX,(Index)in_RSI,blockRows,
               (long)other);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)this_00,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)in_stack_fffffffffffffe28);
  }
  return;
}

Assistant:

void LoopConstraint::calcConstraintJacobian( Model &model,
                              const double time,
                              const Math::VectorNd &Q,
                              const Math::VectorNd &QDot,
                              Math::MatrixNd &GSysUpd,
                              ConstraintCache &cache,
                              bool updateKinematics)
{
    //Please refer to Ch. 8 of Featherstone's Rigid Body Dynamics for details

    //Compute the spatial Jacobians of the predecessor point Gp and the
    //successor point Gs and evaluate Gs-Gp
    cache.mat6NA.setZero();
    cache.mat6NB.setZero();
    CalcPointJacobian6D(model,Q,bodyIds[0],bodyFrames[0].r,cache.mat6NA,
                        updateKinematics);
    CalcPointJacobian6D(model,Q,bodyIds[1],bodyFrames[1].r,cache.mat6NB,
                        updateKinematics);
    cache.mat6NA = cache.mat6NB-cache.mat6NA;

    //Evaluate the transform from the world frame into the constraint frame
    //that is attached to the precessor body
    cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                            updateKinematics);
    cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                           ).transpose()*bodyFrames[0].E;

    for(unsigned int i=0; i<sizeOfConstraint;++i){
      //Resolve each constraint axis into the global frame
      cache.svecA =cache.stA.apply(T[i]);
      //Take the dot product of the constraint axis with Gs-Gp
      GSysUpd.block(rowInSystem+i,0,1,GSysUpd.cols())
          = cache.svecA.transpose()*cache.mat6NA;
    }

}